

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXConverter.cpp
# Opt level: O0

void __thiscall Assimp::FBX::FBXConverter::ConvertGlobalSettings(FBXConverter *this)

{
  aiMetadata *paVar1;
  FileGlobalSettings *pFVar2;
  float fVar3;
  aiVector3D aVar4;
  float local_2a8;
  allocator local_2a1;
  string local_2a0;
  uint64_t local_280;
  allocator local_271;
  string local_270;
  uint64_t local_250;
  allocator local_241;
  string local_240;
  FrameRate local_220;
  allocator local_219;
  string local_218;
  aiVector3t<float> local_1f8;
  aiVector3t<float> local_1e8;
  allocator local_1d9;
  string local_1d8;
  float local_1b8;
  allocator local_1b1;
  string local_1b0;
  double local_190;
  allocator local_181;
  string local_180;
  int local_160;
  allocator local_159;
  string local_158;
  int local_138;
  allocator local_131;
  string local_130;
  int local_110;
  allocator local_109;
  string local_108;
  int local_e8;
  allocator local_e1;
  string local_e0;
  int local_c0;
  allocator local_b9;
  string local_b8;
  int local_98;
  allocator local_91;
  string local_90;
  int local_70;
  allocator local_69;
  string local_68;
  int local_48 [5];
  allocator local_31;
  string local_30;
  FBXConverter *local_10;
  FBXConverter *this_local;
  
  if (this->out != (aiScene *)0x0) {
    local_10 = this;
    paVar1 = aiMetadata::Alloc(0xf);
    this->out->mMetaData = paVar1;
    paVar1 = this->out->mMetaData;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_30,"UpAxis",&local_31);
    pFVar2 = Document::GlobalSettings(this->doc);
    local_48[0] = FileGlobalSettings::UpAxis(pFVar2);
    aiMetadata::Set<int>(paVar1,0,&local_30,local_48);
    std::__cxx11::string::~string((string *)&local_30);
    std::allocator<char>::~allocator((allocator<char> *)&local_31);
    paVar1 = this->out->mMetaData;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_68,"UpAxisSign",&local_69);
    pFVar2 = Document::GlobalSettings(this->doc);
    local_70 = FileGlobalSettings::UpAxisSign(pFVar2);
    aiMetadata::Set<int>(paVar1,1,&local_68,&local_70);
    std::__cxx11::string::~string((string *)&local_68);
    std::allocator<char>::~allocator((allocator<char> *)&local_69);
    paVar1 = this->out->mMetaData;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_90,"FrontAxis",&local_91);
    pFVar2 = Document::GlobalSettings(this->doc);
    local_98 = FileGlobalSettings::FrontAxis(pFVar2);
    aiMetadata::Set<int>(paVar1,2,&local_90,&local_98);
    std::__cxx11::string::~string((string *)&local_90);
    std::allocator<char>::~allocator((allocator<char> *)&local_91);
    paVar1 = this->out->mMetaData;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_b8,"FrontAxisSign",&local_b9);
    pFVar2 = Document::GlobalSettings(this->doc);
    local_c0 = FileGlobalSettings::FrontAxisSign(pFVar2);
    aiMetadata::Set<int>(paVar1,3,&local_b8,&local_c0);
    std::__cxx11::string::~string((string *)&local_b8);
    std::allocator<char>::~allocator((allocator<char> *)&local_b9);
    paVar1 = this->out->mMetaData;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_e0,"CoordAxis",&local_e1);
    pFVar2 = Document::GlobalSettings(this->doc);
    local_e8 = FileGlobalSettings::CoordAxis(pFVar2);
    aiMetadata::Set<int>(paVar1,4,&local_e0,&local_e8);
    std::__cxx11::string::~string((string *)&local_e0);
    std::allocator<char>::~allocator((allocator<char> *)&local_e1);
    paVar1 = this->out->mMetaData;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_108,"CoordAxisSign",&local_109);
    pFVar2 = Document::GlobalSettings(this->doc);
    local_110 = FileGlobalSettings::CoordAxisSign(pFVar2);
    aiMetadata::Set<int>(paVar1,5,&local_108,&local_110);
    std::__cxx11::string::~string((string *)&local_108);
    std::allocator<char>::~allocator((allocator<char> *)&local_109);
    paVar1 = this->out->mMetaData;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_130,"OriginalUpAxis",&local_131);
    pFVar2 = Document::GlobalSettings(this->doc);
    local_138 = FileGlobalSettings::OriginalUpAxis(pFVar2);
    aiMetadata::Set<int>(paVar1,6,&local_130,&local_138);
    std::__cxx11::string::~string((string *)&local_130);
    std::allocator<char>::~allocator((allocator<char> *)&local_131);
    paVar1 = this->out->mMetaData;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_158,"OriginalUpAxisSign",&local_159);
    pFVar2 = Document::GlobalSettings(this->doc);
    local_160 = FileGlobalSettings::OriginalUpAxisSign(pFVar2);
    aiMetadata::Set<int>(paVar1,7,&local_158,&local_160);
    std::__cxx11::string::~string((string *)&local_158);
    std::allocator<char>::~allocator((allocator<char> *)&local_159);
    paVar1 = this->out->mMetaData;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_180,"UnitScaleFactor",&local_181);
    pFVar2 = Document::GlobalSettings(this->doc);
    fVar3 = FileGlobalSettings::UnitScaleFactor(pFVar2);
    local_190 = (double)fVar3;
    aiMetadata::Set<double>(paVar1,8,&local_180,&local_190);
    std::__cxx11::string::~string((string *)&local_180);
    std::allocator<char>::~allocator((allocator<char> *)&local_181);
    paVar1 = this->out->mMetaData;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_1b0,"OriginalUnitScaleFactor",&local_1b1);
    pFVar2 = Document::GlobalSettings(this->doc);
    local_1b8 = FileGlobalSettings::OriginalUnitScaleFactor(pFVar2);
    aiMetadata::Set<float>(paVar1,9,&local_1b0,&local_1b8);
    std::__cxx11::string::~string((string *)&local_1b0);
    std::allocator<char>::~allocator((allocator<char> *)&local_1b1);
    paVar1 = this->out->mMetaData;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_1d8,"AmbientColor",&local_1d9);
    pFVar2 = Document::GlobalSettings(this->doc);
    aVar4 = FileGlobalSettings::AmbientColor(pFVar2);
    local_1f8.z = aVar4.z;
    local_1f8._0_8_ = aVar4._0_8_;
    local_1e8._0_8_ = local_1f8._0_8_;
    local_1e8.z = local_1f8.z;
    aiMetadata::Set<aiVector3t<float>>(paVar1,10,&local_1d8,&local_1e8);
    std::__cxx11::string::~string((string *)&local_1d8);
    std::allocator<char>::~allocator((allocator<char> *)&local_1d9);
    paVar1 = this->out->mMetaData;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_218,"FrameRate",&local_219);
    pFVar2 = Document::GlobalSettings(this->doc);
    local_220 = FileGlobalSettings::TimeMode(pFVar2);
    aiMetadata::Set<int>(paVar1,0xb,&local_218,(int *)&local_220);
    std::__cxx11::string::~string((string *)&local_218);
    std::allocator<char>::~allocator((allocator<char> *)&local_219);
    paVar1 = this->out->mMetaData;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_240,"TimeSpanStart",&local_241);
    pFVar2 = Document::GlobalSettings(this->doc);
    local_250 = FileGlobalSettings::TimeSpanStart(pFVar2);
    aiMetadata::Set<unsigned_long>(paVar1,0xc,&local_240,&local_250);
    std::__cxx11::string::~string((string *)&local_240);
    std::allocator<char>::~allocator((allocator<char> *)&local_241);
    paVar1 = this->out->mMetaData;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_270,"TimeSpanStop",&local_271);
    pFVar2 = Document::GlobalSettings(this->doc);
    local_280 = FileGlobalSettings::TimeSpanStop(pFVar2);
    aiMetadata::Set<unsigned_long>(paVar1,0xd,&local_270,&local_280);
    std::__cxx11::string::~string((string *)&local_270);
    std::allocator<char>::~allocator((allocator<char> *)&local_271);
    paVar1 = this->out->mMetaData;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_2a0,"CustomFrameRate",&local_2a1);
    pFVar2 = Document::GlobalSettings(this->doc);
    local_2a8 = FileGlobalSettings::CustomFrameRate(pFVar2);
    aiMetadata::Set<float>(paVar1,0xe,&local_2a0,&local_2a8);
    std::__cxx11::string::~string((string *)&local_2a0);
    std::allocator<char>::~allocator((allocator<char> *)&local_2a1);
  }
  return;
}

Assistant:

void FBXConverter::ConvertGlobalSettings() {
            if (nullptr == out) {
                return;
            }

            out->mMetaData = aiMetadata::Alloc(15);
            out->mMetaData->Set(0, "UpAxis", doc.GlobalSettings().UpAxis());
            out->mMetaData->Set(1, "UpAxisSign", doc.GlobalSettings().UpAxisSign());
            out->mMetaData->Set(2, "FrontAxis", doc.GlobalSettings().FrontAxis());
            out->mMetaData->Set(3, "FrontAxisSign", doc.GlobalSettings().FrontAxisSign());
            out->mMetaData->Set(4, "CoordAxis", doc.GlobalSettings().CoordAxis());
            out->mMetaData->Set(5, "CoordAxisSign", doc.GlobalSettings().CoordAxisSign());
            out->mMetaData->Set(6, "OriginalUpAxis", doc.GlobalSettings().OriginalUpAxis());
            out->mMetaData->Set(7, "OriginalUpAxisSign", doc.GlobalSettings().OriginalUpAxisSign());
            out->mMetaData->Set(8, "UnitScaleFactor", (double)doc.GlobalSettings().UnitScaleFactor());
            out->mMetaData->Set(9, "OriginalUnitScaleFactor", doc.GlobalSettings().OriginalUnitScaleFactor());
            out->mMetaData->Set(10, "AmbientColor", doc.GlobalSettings().AmbientColor());
            out->mMetaData->Set(11, "FrameRate", (int)doc.GlobalSettings().TimeMode());
            out->mMetaData->Set(12, "TimeSpanStart", doc.GlobalSettings().TimeSpanStart());
            out->mMetaData->Set(13, "TimeSpanStop", doc.GlobalSettings().TimeSpanStop());
            out->mMetaData->Set(14, "CustomFrameRate", doc.GlobalSettings().CustomFrameRate());
        }